

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NanInf.cpp
# Opt level: O3

void __thiscall
anon_unknown.dwarf_63b2::FloatxNanInfTest_cast_nans_Test::~FloatxNanInfTest_cast_nans_Test
          (FloatxNanInfTest_cast_nans_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(FloatxNanInfTest, cast_nans)
{
    using T1 = flexfloat<2, 3>;
    #ifdef FLEXFLOAT_ON_SINGLE
    using T2 = flexfloat<7, 21>;
    #endif
    #ifdef FLEXFLOAT_ON_DOUBLE
    using T2 = flexfloat<10, 50>;
    #endif
    #ifdef FLEXFLOAT_ON_QUAD
    using T2 = flexfloat<12, 100>;
    #endif
    T1 a = 0.0 / 0.0;
    T2 b = 0.0;
    b = a;

    fp_t constnan =  nan;

    EXPECT_NE(a, a);    // holds only for NANs
    EXPECT_NE(a, nan);  // holds only for NANs
    // EXPECT_EQ(*reinterpret_cast<uint_t*>(&a),
    //           *reinterpret_cast<uint_t*>(&constnan));

    EXPECT_NE(b, b);    // holds only for NANs
    EXPECT_NE(b, nan);  // holds only for NANs

}